

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

DP_RS_Stream
MpiInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
             attr_list WriterContact,SstStats Stats)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R9;
  CMFormat F;
  SMPI_Comm comm;
  CManager cm;
  MpiStreamRD Stream;
  int *in_stack_ffffffffffffffa8;
  SMPI_Comm in_stack_ffffffffffffffb0;
  
  puVar1 = (undefined8 *)calloc(0x90,1);
  uVar2 = (*(code *)in_RDI[1])(in_RSI);
  (*(code *)in_RDI[3])(in_RSI);
  *puVar1 = in_RSI;
  uVar3 = GetUniqueTaskId();
  puVar1[2] = uVar3;
  puVar1[5] = in_R9;
  SMPI_Comm_rank(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  uVar4 = CMregister_format(uVar2,MpiReadRequestStructs);
  puVar1[6] = uVar4;
  uVar2 = CMregister_format(uVar2,MpiReadReplyStructs);
  CMregister_handler(uVar2,MpiReadReplyHandler,in_RDI);
  snprintf((char *)(puVar1 + 7),0x40,"Reader Rank %d",(ulong)*(uint *)(puVar1 + 1));
  puVar1[0xf] = puVar1;
  *in_RDX = puVar1 + 7;
  (*(code *)*in_RDI)(*puVar1,5,"MPI dataplane reader initialized, reader rank %d\n",
                     *(undefined4 *)(puVar1 + 1));
  return puVar1;
}

Assistant:

static DP_RS_Stream MpiInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                  struct _SstParams *Params, attr_list WriterContact,
                                  SstStats Stats)
{
    MpiStreamRD Stream = calloc(sizeof(struct _MpiStreamRD), 1);
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    Stream->Stream.CP_Stream = CP_Stream;
    Stream->Stream.taskID = GetUniqueTaskId();
    Stream->Link.Stats = Stats;

    SMPI_Comm_rank(comm, &Stream->Stream.Rank);

    /* add a handler for read reply messages */
    Stream->ReadRequestFormat = CMregister_format(cm, MpiReadRequestStructs);
    F = CMregister_format(cm, MpiReadReplyStructs);
    CMregister_handler(F, MpiReadReplyHandler, Svcs);

    /* Generate Contact info */
    snprintf(Stream->MyContactInfo.ContactString, MPI_DP_CONTACT_STRING_LEN, "Reader Rank %d",
             Stream->Stream.Rank);
    Stream->MyContactInfo.StreamRS = Stream;
    *ReaderContactInfoPtr = &Stream->MyContactInfo;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                  "MPI dataplane reader initialized, reader rank %d\n", Stream->Stream.Rank);

    return Stream;
}